

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::InsertEdgeIntoAEL(Clipper *this,TEdge *edge)

{
  double dVar1;
  TEdge *pTVar2;
  long lVar3;
  TEdge *pTVar4;
  bool bVar5;
  TEdge **ppTVar6;
  
  edge->nextInAEL = (TEdge *)0x0;
  edge->prevInAEL = (TEdge *)0x0;
  pTVar2 = this->m_ActiveEdges;
  ppTVar6 = &this->m_ActiveEdges;
  if (pTVar2 != (TEdge *)0x0) {
    dVar1 = edge->dx;
    lVar3 = edge->xcurr;
    bVar5 = lVar3 < pTVar2->xcurr;
    if (lVar3 == pTVar2->xcurr) {
      bVar5 = pTVar2->dx <= dVar1 && dVar1 != pTVar2->dx;
    }
    if (bVar5) {
      edge->nextInAEL = pTVar2;
      (*ppTVar6)->prevInAEL = edge;
    }
    else {
      do {
        pTVar2 = *ppTVar6;
        ppTVar6 = &pTVar2->nextInAEL;
        pTVar4 = pTVar2->nextInAEL;
        if (pTVar4 == (TEdge *)0x0) break;
        bVar5 = lVar3 < pTVar4->xcurr;
        if (lVar3 == pTVar4->xcurr) {
          bVar5 = pTVar4->dx <= dVar1 && dVar1 != pTVar4->dx;
        }
      } while (!bVar5);
      edge->nextInAEL = pTVar4;
      if (*ppTVar6 != (TEdge *)0x0) {
        (*ppTVar6)->prevInAEL = edge;
      }
      edge->prevInAEL = pTVar2;
    }
  }
  *ppTVar6 = edge;
  return;
}

Assistant:

void Clipper::InsertEdgeIntoAEL(TEdge *edge)
{
  edge->prevInAEL = 0;
  edge->nextInAEL = 0;
  if( !m_ActiveEdges )
  {
    m_ActiveEdges = edge;
  }
  else if( E2InsertsBeforeE1(*m_ActiveEdges, *edge) )
  {
    edge->nextInAEL = m_ActiveEdges;
    m_ActiveEdges->prevInAEL = edge;
    m_ActiveEdges = edge;
  } else
  {
    TEdge* e = m_ActiveEdges;
    while( e->nextInAEL  && !E2InsertsBeforeE1(*e->nextInAEL , *edge) )
      e = e->nextInAEL;
    edge->nextInAEL = e->nextInAEL;
    if( e->nextInAEL ) e->nextInAEL->prevInAEL = edge;
    edge->prevInAEL = e;
    e->nextInAEL = edge;
  }
}